

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::NotEqual(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  Variable VVar3;
  Variable VVar4;
  Variable var1;
  
  VVar3 = popOpStack(this);
  VVar4 = popOpStack(this);
  var1.field_1 = VVar4.field_1;
  var1._4_4_ = 0;
  var1.type = VVar4.type;
  VVar4._4_4_ = 0;
  VVar4.type = VVar3.type;
  VVar4.field_1.integerValue = VVar3.field_1.integerValue;
  bVar2 = variableEquals(this,var1,VVar4);
  VVar3.field_1.boolValue = !bVar2;
  VVar3._0_8_ = 2;
  VVar3.field_1.integerValue._1_7_ = 0;
  pushOpStack(this,VVar3);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::NotEqual() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(!this->variableEquals(first, second));
  this->advance();
}